

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

ReaderInitializeType __thiscall
duckdb::MultiFileColumnMapper::CreateMapping(MultiFileColumnMapper *this)

{
  undefined1 __p [8];
  ReaderInitializeType RVar1;
  BaseFileReader *pBVar2;
  undefined1 local_a0 [8];
  map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
  remaining_filters;
  ResultColumnMapping result;
  
  CreateColumnMapping(&result,this);
  remaining_filters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &remaining_filters._M_t._M_impl.super__Rb_tree_header._M_header;
  remaining_filters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  remaining_filters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  remaining_filters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  remaining_filters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       remaining_filters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RVar1 = EvaluateConstantFilters(this,&result,&remaining_filters);
  if (RVar1 != SKIP_READING_FILE) {
    CreateFilters((MultiFileColumnMapper *)local_a0,
                  (map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
                   *)this,(ResultColumnMapping *)&remaining_filters);
    pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&this->reader_data->reader);
    __p = local_a0;
    local_a0 = (undefined1  [8])0x0;
    ::std::__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
    reset((__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *)
          &pBVar2->filters,(pointer)__p);
    ::std::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
    ~unique_ptr((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *)
                local_a0);
  }
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
  ::~_Rb_tree(&remaining_filters._M_t);
  ResultColumnMapping::~ResultColumnMapping(&result);
  return (uint)(RVar1 == SKIP_READING_FILE);
}

Assistant:

ReaderInitializeType MultiFileColumnMapper::CreateMapping() {
	// copy global columns and inject any different defaults
	auto result = CreateColumnMapping();
	//! Evaluate the filters against the column(s) that are constant for this file (not present in the local schema)
	//! If any of these fail, the file can be skipped entirely
	map<idx_t, reference<TableFilter>> remaining_filters;
	auto evaluate_result = EvaluateConstantFilters(result, remaining_filters);
	if (evaluate_result == ReaderInitializeType::SKIP_READING_FILE) {
		return ReaderInitializeType::SKIP_READING_FILE;
	}

	reader_data.reader->filters = CreateFilters(remaining_filters, result);

	// for any remaining casts - push them as expressions
	return ReaderInitializeType::INITIALIZED;
}